

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QRMaskUtil.cpp
# Opt level: O2

int ZXing::QRCode::MaskUtil::CalculateMaskPenalty(TritMatrix *matrix)

{
  Trit *begin;
  value_t vVar1;
  uint uVar2;
  pointer pTVar3;
  bool bVar4;
  difference_type __n;
  pointer pTVar5;
  long lVar6;
  int iVar7;
  pointer pTVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  array<bool,_4UL> local_98;
  int local_94;
  pointer local_90;
  long local_88;
  pointer local_80;
  long local_78;
  ulong local_70;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  ulong local_58;
  TritMatrix *local_50;
  ulong local_48;
  long local_40;
  pointer local_38;
  
  local_64 = ApplyMaskPenaltyRule1Internal(matrix,true);
  uVar15 = 0;
  local_68 = ApplyMaskPenaltyRule1Internal(matrix,false);
  uVar2 = matrix->_height;
  local_88 = (long)(int)uVar2;
  uVar11 = matrix->_width;
  local_90 = (pointer)(long)(int)uVar11;
  local_80 = (matrix->_data).super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
             super__Vector_impl_data._M_start;
  uVar14 = (ulong)(uVar11 - 1);
  if ((int)(uVar11 - 1) < 1) {
    uVar14 = uVar15;
  }
  uVar10 = 1;
  if (1 < (int)uVar2) {
    uVar10 = uVar2;
  }
  local_58 = 0;
  pTVar8 = local_80;
  pTVar5 = local_80;
  while (pTVar5 = pTVar5 + (long)local_90, uVar15 != uVar10 - 1) {
    uVar15 = uVar15 + 1;
    lVar13 = 0;
    while (lVar9 = lVar13, lVar13 = lVar9 + 1, lVar13 - uVar14 != 1) {
      vVar1 = pTVar8[lVar9].value;
      if (((pTVar8[lVar13].value == true_v) == (vVar1 == true_v)) &&
         ((vVar1 == true_v) == (pTVar5[lVar9].value == true_v))) {
        local_58 = (ulong)((int)local_58 +
                          (uint)((pTVar5[lVar13].value != true_v) != (vVar1 == true_v)));
      }
    }
    pTVar8 = pTVar8 + (long)local_90;
  }
  local_98._M_elems[0] = false;
  local_98._M_elems[1] = false;
  local_98._M_elems[2] = false;
  local_98._M_elems[3] = false;
  pTVar5 = local_90 + -7;
  lVar13 = local_88 + -7;
  local_40 = (long)local_90 * 7;
  uVar15 = 0;
  uVar14 = 0;
  if (0 < (int)uVar11) {
    uVar14 = (ulong)uVar11;
  }
  local_48 = 0;
  if (0 < (int)uVar2) {
    local_48 = (ulong)uVar2;
  }
  local_94 = 0;
  local_78 = lVar13;
  local_70 = uVar14;
  local_50 = matrix;
  do {
    if (uVar15 == local_48) {
      lVar13 = 0;
      for (lVar9 = 0; (int)local_88 * (int)local_90 != lVar9; lVar9 = lVar9 + 1) {
        lVar13 = lVar13 + (ulong)(local_80[lVar9].value == true_v);
      }
      lVar6 = (long)(*(int *)&(local_50->_data).
                              super__Vector_base<ZXing::Trit,_std::allocator<ZXing::Trit>_>._M_impl.
                              super__Vector_impl_data._M_finish - (int)local_80);
      lVar9 = lVar13 * 2 - lVar6;
      lVar13 = -lVar9;
      if (0 < lVar9) {
        lVar13 = lVar9;
      }
      return (int)((lVar13 * 10) / lVar6) * 10 +
             local_94 * 0x28 + (int)local_58 * 3 + local_68 + local_64;
    }
    uVar11 = (uint)uVar15;
    uVar2 = 4;
    if (uVar11 < 4) {
      uVar2 = uVar11;
    }
    local_5c = -uVar2;
    local_60 = (int)local_88 - uVar11;
    if (10 < local_60) {
      local_60 = 0xb;
    }
    local_60 = local_60 + -7;
    pTVar8 = local_80 + uVar15 * (long)local_90;
    local_38 = pTVar8;
    for (uVar12 = 0; uVar12 != uVar14; uVar12 = uVar12 + 1) {
      begin = local_38 + uVar12;
      if (((long)uVar12 <= (long)pTVar5) &&
         (bVar4 = HasPatternAt<7ul>((array<bool,_7UL> *)&DAT_001a9ddc,begin,1,(int)pTVar8),
         lVar13 = local_78, bVar4)) {
        uVar11 = (uint)uVar12;
        uVar2 = 4;
        if (uVar11 < 4) {
          uVar2 = uVar11;
        }
        pTVar8 = (pointer)0x1;
        bVar4 = HasPatternAt<4ul>(&local_98,begin,-uVar2,1);
        if (!bVar4) {
          iVar7 = (int)local_90 - uVar11;
          if (10 < iVar7) {
            iVar7 = 0xb;
          }
          pTVar8 = (pointer)0x1;
          bVar4 = HasPatternAt<4ul>(&local_98,begin + 7,iVar7 + -7,1);
          lVar13 = local_78;
          if (!bVar4) goto LAB_00196dff;
        }
        local_94 = local_94 + 1;
        lVar13 = local_78;
      }
LAB_00196dff:
      pTVar3 = local_90;
      if ((long)uVar15 <= lVar13) {
        iVar7 = (int)local_90;
        bVar4 = HasPatternAt<7ul>((array<bool,_7UL> *)&DAT_001a9ddc,begin,iVar7,(int)pTVar8);
        uVar14 = local_70;
        if (bVar4) {
          pTVar8 = (pointer)((ulong)pTVar3 & 0xffffffff);
          bVar4 = HasPatternAt<4ul>(&local_98,begin,local_5c,iVar7);
          if ((bVar4) ||
             (pTVar8 = local_90,
             bVar4 = HasPatternAt<4ul>(&local_98,begin + local_40,local_60,(int)local_90),
             uVar14 = local_70, bVar4)) {
            local_94 = local_94 + 1;
            uVar14 = local_70;
          }
        }
      }
    }
    uVar15 = uVar15 + 1;
  } while( true );
}

Assistant:

int CalculateMaskPenalty(const TritMatrix& matrix)
{
	return MaskUtil::ApplyMaskPenaltyRule1(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule2(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule3(matrix)
		   + MaskUtil::ApplyMaskPenaltyRule4(matrix);
}